

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bid_fx_exception_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::exceptions::BidFXExceptionTest_test_what_works_Test::TestBody
          (BidFXExceptionTest_test_what_works_Test *this)

{
  BidFXException *this_00;
  AssertionResult gtest_ar;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  this_00 = (BidFXException *)__cxa_allocate_exception(0x28);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"exception what message works","");
  bidfx_public_api::exceptions::BidFXException::BidFXException(this_00,(string *)local_48);
  __cxa_throw(this_00,&BidFXException::typeinfo,BidFXException::~BidFXException);
}

Assistant:

TEST(BidFXExceptionTest, test_what_works)
{
    try
    {
        throw BidFXException("exception what message works");
    }
    catch (BidFXException& e)
    {
        EXPECT_STREQ("exception what message works", e.what());
    }

}